

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sljitNativeX86_64.c
# Opt level: O0

sljit_s32 emit_load_imm64(sljit_compiler *compiler,sljit_s32 reg,sljit_sw imm)

{
  byte bVar1;
  undefined1 *puVar2;
  sljit_u8 *inst;
  sljit_sw imm_local;
  sljit_s32 reg_local;
  sljit_compiler *compiler_local;
  
  puVar2 = (undefined1 *)ensure_buf(compiler,0xb);
  if (puVar2 == (undefined1 *)0x0) {
    compiler_local._4_4_ = compiler->error;
  }
  else {
    *puVar2 = 10;
    compiler->size = compiler->size + 10;
    bVar1 = 0x41;
    if (""[reg] < 8) {
      bVar1 = 0;
    }
    puVar2[1] = bVar1 | 0x48;
    puVar2[2] = (""[reg] & 7) + 0xb8;
    sljit_unaligned_store_sw(puVar2 + 3,imm);
    compiler_local._4_4_ = 0;
  }
  return compiler_local._4_4_;
}

Assistant:

static sljit_s32 emit_load_imm64(struct sljit_compiler *compiler, sljit_s32 reg, sljit_sw imm)
{
	sljit_u8 *inst;

	inst = (sljit_u8*)ensure_buf(compiler, 1 + 2 + sizeof(sljit_sw));
	FAIL_IF(!inst);
	INC_SIZE(2 + sizeof(sljit_sw));
	*inst++ = REX_W | ((reg_map[reg] <= 7) ? 0 : REX_B);
	*inst++ = MOV_r_i32 + (reg_map[reg] & 0x7);
	sljit_unaligned_store_sw(inst, imm);
	return SLJIT_SUCCESS;
}